

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O2

qint64 __thiscall QFSFileEnginePrivate::readFdFh(QFSFileEnginePrivate *this,char *data,qint64 len)

{
  QAbstractFileEngine *this_00;
  int iVar1;
  size_t sVar2;
  ssize_t sVar3;
  __off64_t __off;
  int *piVar4;
  FILE *pFVar5;
  qint64 qVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QAbstractFileEnginePrivate).q_ptr;
  if (len < 0) {
    QSystemError::stdString((QString *)&local_50,0x16);
    QAbstractFileEngine::setError(this_00,ReadError,(QString *)&local_50);
  }
  else {
    pFVar5 = (FILE *)this->fh;
    if (pFVar5 != (FILE *)0x0) {
      qVar6 = 0;
      do {
        sVar2 = fread(data + qVar6,1,len - qVar6,pFVar5);
        iVar1 = feof((FILE *)this->fh);
        if ((iVar1 != 0) && (sVar2 == 0)) {
          pFVar5 = (FILE *)this->fh;
          __off = ftello64(pFVar5);
          fseeko64(pFVar5,__off,0);
          goto LAB_00228dfc;
        }
        qVar6 = qVar6 + sVar2;
        if (iVar1 != 0) goto LAB_00228dfc;
        if (sVar2 == 0) {
          piVar4 = __errno_location();
          if (*piVar4 != 4) goto LAB_00228dc1;
        }
        else if (len <= qVar6) goto LAB_00228dc1;
        pFVar5 = (FILE *)this->fh;
      } while( true );
    }
    if (this->fd == -1) {
      qVar6 = 0;
LAB_00228dc1:
      bVar7 = false;
    }
    else {
      qVar6 = 0;
      do {
        sVar2 = len - qVar6;
        if (0x7ffffffffffffffe < sVar2) {
          sVar2 = 0x7fffffffffffffff;
        }
        iVar1 = this->fd;
        while (sVar3 = read(iVar1,data + qVar6,sVar2), sVar3 == -1) {
          piVar4 = __errno_location();
          if (*piVar4 != 4) {
            bVar7 = false;
            goto LAB_00228dc3;
          }
        }
      } while ((0 < sVar3) && (qVar6 = qVar6 + sVar3, qVar6 < len));
      bVar7 = sVar3 == 0;
    }
LAB_00228dc3:
    if ((bVar7) || (qVar6 != 0)) goto LAB_00228dfc;
    piVar4 = __errno_location();
    QSystemError::stdString((QString *)&local_50,*piVar4);
    QAbstractFileEngine::setError(this_00,ReadError,(QString *)&local_50);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  qVar6 = -1;
LAB_00228dfc:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return qVar6;
}

Assistant:

qint64 QFSFileEnginePrivate::readFdFh(char *data, qint64 len)
{
    Q_Q(QFSFileEngine);

    if (len < 0 || len != qint64(size_t(len))) {
        q->setError(QFile::ReadError, QSystemError::stdString(EINVAL));
        return -1;
    }

    qint64 readBytes = 0;
    bool eof = false;

    if (fh) {
        // Buffered stdlib mode.

        size_t result;
        do {
            result = fread(data + readBytes, 1, size_t(len - readBytes), fh);
            eof = feof(fh); // Doesn't change errno
            if (eof && result == 0) {
                // On OS X, this is needed, e.g., if a file was written to
                // through another stream since our last read. See test
                // tst_QFile::appendAndRead
                QT_FSEEK(fh, QT_FTELL(fh), SEEK_SET); // re-sync stream.
                break;
            }
            readBytes += result;
        } while (!eof && (result == 0 ? errno == EINTR : readBytes < len));

    } else if (fd != -1) {
        // Unbuffered stdio mode.

        SignedIOType result;
        do {
            // calculate the chunk size
            // on Windows or 32-bit no-largefile Unix, we'll need to read in chunks
            // we limit to the size of the signed type, otherwise we could get a negative number as a result
            quint64 wantedBytes = quint64(len) - quint64(readBytes);
            UnsignedIOType chunkSize = std::numeric_limits<SignedIOType>::max();
            if (chunkSize > wantedBytes)
                chunkSize = wantedBytes;
            result = QT_READ(fd, data + readBytes, chunkSize);
        } while (result > 0 && (readBytes += result) < len);

        // QT_READ (::read()) returns 0 to indicate end-of-file
        eof = result == 0;
    }

    if (!eof && readBytes == 0) {
        readBytes = -1;
        q->setError(QFile::ReadError, QSystemError::stdString(errno));
    }

    return readBytes;
}